

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O1

double __thiscall
imrt::EvaluationFunction::get_delta_eval
          (EvaluationFunction *this,
          list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff,double angle,
          vector<double,_std::allocator<double>_> *w,vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,int n_voxels)

{
  _Rb_tree_header *p_Var1;
  double dVar2;
  int iVar3;
  bool bVar4;
  char cVar5;
  Matrix *pMVar6;
  _Rb_tree_node_base *p_Var7;
  _List_node_base *p_Var8;
  int iVar9;
  iterator __end2;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double local_58;
  
  p_Var7 = (this->voxels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->voxels)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 == p_Var1) {
    local_58 = 0.0;
  }
  else {
    iVar9 = 0;
    local_58 = 0.0;
    do {
      iVar3 = *(int *)&p_Var7[1]._M_parent;
      lVar10 = (long)*(int *)((long)&p_Var7[1]._M_parent + 4);
      pMVar6 = Volume::getDepositionMatrix
                         ((this->volumes->
                          super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
                          super__Vector_impl_data._M_start + iVar3,(int)angle);
      p_Var8 = (diff->
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
               _M_impl._M_node.super__List_node_base._M_next;
      dVar11 = 0.0;
      if (p_Var8 != (_List_node_base *)diff) {
        do {
          dVar11 = dVar11 + pMVar6->p[lVar10][*(int *)&p_Var8[1]._M_next] *
                            (double)p_Var8[1]._M_prev;
          p_Var8 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                     )&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        } while (p_Var8 != (_List_node_base *)diff);
      }
      cVar5 = '\x03';
      if ((dVar11 != 0.0) || (NAN(dVar11))) {
        dVar12 = *(double *)
                  (*(long *)&(this->Z).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar3].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data + lVar10 * 8);
        dVar2 = (Zmin->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[iVar3];
        dVar13 = dVar11 + dVar12;
        if ((dVar2 <= dVar12) || (dVar2 <= dVar13)) {
          if (dVar2 <= dVar12) {
            dVar12 = 0.0;
            if (dVar13 < dVar2) {
              dVar12 = (dVar2 - dVar13) * (dVar2 - dVar13) *
                       (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[iVar3] + 0.0;
            }
          }
          else {
            dVar12 = 0.0 - (dVar2 - dVar12) * (dVar2 - dVar12) *
                           (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[iVar3];
          }
        }
        else {
          dVar12 = ((dVar12 - dVar2) + (dVar12 - dVar2) + dVar11) *
                   (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar3] * dVar11 + 0.0;
        }
        dVar2 = *(double *)
                 (*(long *)&(this->Z).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[iVar3].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data + lVar10 * 8);
        dVar13 = (Zmax->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar3];
        dVar14 = dVar11 + dVar2;
        if ((dVar2 <= dVar13) || (dVar14 <= dVar13)) {
          if (dVar2 <= dVar13) {
            if (dVar13 < dVar14) {
              dVar12 = dVar12 + (dVar14 - dVar13) * (dVar14 - dVar13) *
                                (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[iVar3];
            }
          }
          else {
            dVar12 = dVar12 - (dVar2 - dVar13) * (dVar2 - dVar13) *
                              (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_start[iVar3];
          }
        }
        else {
          dVar12 = dVar12 + ((dVar2 - dVar13) + (dVar2 - dVar13) + dVar11) *
                            (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[iVar3] * dVar11;
        }
        local_58 = local_58 +
                   dVar12 / (double)(this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[iVar3];
        bVar4 = n_voxels <= iVar9;
        iVar9 = iVar9 + 1;
        cVar5 = bVar4 * '\x02';
      }
    } while (((cVar5 == '\x03') || (cVar5 == '\0')) &&
            (p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7),
            (_Rb_tree_header *)p_Var7 != p_Var1));
  }
  return local_58;
}

Assistant:

double EvaluationFunction::get_delta_eval(list< pair< int, double > >& diff, double angle,
                                          vector<double>& w, vector<double>& Zmin, 
                                          vector<double>& Zmax,int n_voxels) const{
  
  double delta_F=0.0;
  int b;
  double delta_intensity, delta;
  
  int i=0;
  for(auto voxel:voxels){
    int o=voxel.second.first;
    int k=voxel.second.second;
    const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
    
    delta = 0;
    for (auto let:diff){
      b = let.first;
      delta_intensity = let.second;
      delta = delta + Dep(k,b)*(delta_intensity);
    }
    if(delta==0.0) continue;
    
    double pen=0.0;
    //with the change in the dose of a voxel we can incrementally modify the value of F
    if(Z[o][k] < Zmin[o] && Z[o][k] + delta < Zmin[o]) //update the penalty
      pen += w[o]*delta*(delta+2*(Z[o][k]-Zmin[o]));
    else if(Z[o][k] < Zmin[o]) //the penalty disappears
      pen -=  w[o] * ( pow(Zmin[o]-Z[o][k], 2) );
    else if(Z[o][k] + delta < Zmin[o]) //the penalty appears
      pen +=  w[o] * ( pow(Zmin[o]-(Z[o][k]+delta), 2) );
    
    if(Z[o][k] > Zmax[o] && Z[o][k] + delta > Zmax[o]) //update the penalty
      pen += w[o]*delta*(delta+2*(-Zmax[o] + Z[o][k]));
    else if(Z[o][k] > Zmax[o]) //the penalty disappears
      pen -=  w[o] * ( pow(Z[o][k]-Zmax[o], 2) );
    else if(Z[o][k] + delta > Zmax[o]) //the penalty appears
      pen +=  w[o] * ( pow(Z[o][k]+delta - Zmax[o], 2) );
    
    delta_F += pen/nb_voxels[o];
    i++; if(i>n_voxels) break;
  }
  return delta_F;
}